

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O0

int pfx_table_append_elem(node_data *data,pfx_record *record)

{
  long lVar1;
  data_elem *pdVar2;
  long in_FS_OFFSET;
  data_elem *tmp;
  pfx_record *record_local;
  node_data *data_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pdVar2 = (data_elem *)lrtr_realloc(data->ary,(ulong)(data->len + 1) << 4);
  if (pdVar2 == (data_elem *)0x0) {
    data_local._4_4_ = -1;
  }
  else {
    data->len = data->len + 1;
    data->ary = pdVar2;
    data->ary[data->len - 1].asn = record->asn;
    data->ary[data->len - 1].max_len = record->max_len;
    data->ary[data->len - 1].socket = record->socket;
    data_local._4_4_ = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return data_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

int pfx_table_append_elem(struct node_data *data, const struct pfx_record *record)
{
	struct data_elem *tmp = lrtr_realloc(data->ary, sizeof(struct data_elem) * ((data->len) + 1));

	if (!tmp)
		return PFX_ERROR;
	data->len++;
	data->ary = tmp;
	data->ary[data->len - 1].asn = record->asn;
	data->ary[data->len - 1].max_len = record->max_len;
	data->ary[data->len - 1].socket = record->socket;
	return PFX_SUCCESS;
}